

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VCFrontEnd.cpp
# Opt level: O2

int VCFrontEnd::exec(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  time_t tVar3;
  MeshSimplify *this;
  VertexClustering *this_00;
  ostream *poVar4;
  stat *__buf;
  string *filePath;
  double _ratio;
  string in_str;
  allocator local_aa;
  allocator local_a9;
  InputParser input;
  string out_str;
  Options opts;
  string local_58;
  string local_38;
  
  VCTools::InputParser::InputParser(&input,argc,argv);
  opts.adaptive = false;
  opts.anisotropic = false;
  opts.quadMetric = false;
  opts.validation = false;
  opts.ringLevel = 2;
  opts.numCluster = 400;
  tVar3 = time((time_t *)0x0);
  opts.seed = (int)tVar3;
  std::__cxx11::string::string((string *)&in_str,"-h",(allocator *)&out_str);
  bVar1 = VCTools::InputParser::cmdOptionExists(&input,&in_str);
  std::__cxx11::string::~string((string *)&in_str);
  if (argc < 2 || bVar1) {
    showHelpPage();
  }
  else {
    std::__cxx11::string::string((string *)&in_str,"-q",(allocator *)&out_str);
    bVar1 = VCTools::InputParser::cmdOptionExists(&input,&in_str);
    std::__cxx11::string::~string((string *)&in_str);
    if (bVar1) {
      opts.quadMetric = true;
    }
    std::__cxx11::string::string((string *)&in_str,"-o1",(allocator *)&out_str);
    bVar1 = VCTools::InputParser::cmdOptionExists(&input,&in_str);
    std::__cxx11::string::~string((string *)&in_str);
    if (bVar1) {
      opts.adaptive = true;
    }
    std::__cxx11::string::string((string *)&in_str,"-o2",(allocator *)&out_str);
    bVar1 = VCTools::InputParser::cmdOptionExists(&input,&in_str);
    std::__cxx11::string::~string((string *)&in_str);
    if (bVar1) {
      opts.anisotropic = true;
    }
    std::__cxx11::string::string((string *)&in_str,"-o3",(allocator *)&out_str);
    bVar1 = VCTools::InputParser::cmdOptionExists(&input,&in_str);
    std::__cxx11::string::~string((string *)&in_str);
    if (bVar1) {
      opts.anisotropic = true;
      opts.quadMetric = true;
    }
    std::__cxx11::string::string((string *)&in_str,"-v",(allocator *)&out_str);
    bVar1 = VCTools::InputParser::cmdOptionExists(&input,&in_str);
    std::__cxx11::string::~string((string *)&in_str);
    if (bVar1) {
      opts.validation = true;
    }
    std::__cxx11::string::string((string *)&in_str,"-n",(allocator *)&out_str);
    bVar1 = VCTools::InputParser::cmdOptionExists(&input,&in_str);
    std::__cxx11::string::~string((string *)&in_str);
    if (bVar1) {
      std::__cxx11::string::string((string *)&in_str,"-n",(allocator *)&out_str);
      iVar2 = VCTools::InputParser::getIntArg(&input,&in_str,400);
      opts.numCluster = (size_t)iVar2;
      std::__cxx11::string::~string((string *)&in_str);
    }
    std::__cxx11::string::string((string *)&in_str,"-r",(allocator *)&out_str);
    bVar1 = VCTools::InputParser::cmdOptionExists(&input,&in_str);
    std::__cxx11::string::~string((string *)&in_str);
    if (bVar1) {
      std::__cxx11::string::string((string *)&in_str,"-r",(allocator *)&out_str);
      iVar2 = VCTools::InputParser::getIntArg(&input,&in_str,2);
      opts.ringLevel = iVar2;
      std::__cxx11::string::~string((string *)&in_str);
    }
    std::__cxx11::string::string((string *)&in_str,"-seed",(allocator *)&out_str);
    bVar1 = VCTools::InputParser::cmdOptionExists(&input,&in_str);
    std::__cxx11::string::~string((string *)&in_str);
    if (bVar1) {
      std::__cxx11::string::string((string *)&in_str,"-seed",(allocator *)&out_str);
      opts.seed = VCTools::InputParser::getIntArg(&input,&in_str,(int)tVar3);
      std::__cxx11::string::~string((string *)&in_str);
    }
    std::__cxx11::string::string
              ((string *)&in_str,
               (string *)
               (input.tokens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
    std::__cxx11::string::string((string *)&local_58,"-f",&local_a9);
    bVar1 = VCTools::InputParser::cmdOptionExists(&input,&local_58);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_38,"-f",&local_aa);
      VCTools::InputParser::getCmdOption(&out_str,&input,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    else {
      genOutputFileName(&out_str,&in_str,&opts);
    }
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"-quad",(allocator *)&local_38);
    bVar1 = VCTools::InputParser::cmdOptionExists(&input,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) {
      this = (MeshSimplify *)operator_new(0x20);
      MeshSimplify::MeshSimplify(this);
      freopen(in_str._M_dataplus._M_p,"r",_stdin);
      freopen(out_str._M_dataplus._M_p,"w",_stdout);
      std::__cxx11::string::string((string *)&local_58,"-ratio",(allocator *)&local_38);
      _ratio = VCTools::InputParser::getFloatArg(&input,&local_58,0.1);
      MeshSimplify::setRatio(this,_ratio);
      std::__cxx11::string::~string((string *)&local_58);
      MeshSimplify::input(this);
      MeshSimplify::start(this);
      MeshSimplify::output(this);
      MeshSimplify::~MeshSimplify(this);
      operator_delete(this);
    }
    else {
      this_00 = (VertexClustering *)operator_new(0xd8);
      VertexClustering::VertexClustering(this_00,&opts);
      VertexClustering::input(this_00,&in_str);
      VertexClustering::start(this_00);
      VertexClustering::build(this_00);
      filePath = &out_str;
      VertexClustering::output(this_00,filePath);
      VertexClustering::stat(this_00,(char *)filePath,__buf);
      poVar4 = std::operator<<((ostream *)&std::cout,"file saved in ");
      poVar4 = std::operator<<(poVar4,(string *)&out_str);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    std::__cxx11::string::~string((string *)&out_str);
    std::__cxx11::string::~string((string *)&in_str);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&input.tokens);
  return 0;
}

Assistant:

int VCFrontEnd::exec(int argc, char** argv) {
	VCTools::InputParser input(argc, argv);
	VertexClustering::Options opts;
	opts.adaptive = false;
	opts.anisotropic = false;
	opts.numCluster = 400;
	opts.quadMetric = false;
	opts.validation = false;
	opts.ringLevel = 2;
	opts.seed = time(0);
	if (input.cmdOptionExists("-h") || argc < 2) {
		showHelpPage();
		return 0;
	}
	if (input.cmdOptionExists("-q")) opts.quadMetric = true;
	if (input.cmdOptionExists("-o1")) opts.adaptive = true;
	if (input.cmdOptionExists("-o2")) opts.anisotropic = true;
	if (input.cmdOptionExists("-o3")) {
		opts.anisotropic = true; 
		opts.quadMetric = true;
	}
	if (input.cmdOptionExists("-v")) opts.validation = true;
	if (input.cmdOptionExists("-n")) 
		opts.numCluster = input.getIntArg("-n", opts.numCluster);
	if (input.cmdOptionExists("-r")) 
		opts.ringLevel = input.getIntArg("-r", opts.ringLevel);
	if (input.cmdOptionExists("-seed")) 
		opts.seed = input.getIntArg("-seed", opts.seed);
	string in_str = input.getLastArg();
	string out_str = input.cmdOptionExists("-f") ? input.getCmdOption("-f") : genOutputFileName(in_str, opts);

	if (input.cmdOptionExists("-quad")) {
		MeshSimplify *ms = new MeshSimplify();
		FILE *_;
		_ = freopen(in_str.c_str(), "r", stdin);
		_ = freopen(out_str.c_str(), "w", stdout);
		ms->setRatio(input.getFloatArg("-ratio", 0.1));
		ms->input();
		ms->start();
		ms->output();
		delete ms;
		return 0;
	}
	VertexClustering* vc = new VertexClustering(opts);
	vc->input(in_str);
	vc->start();
	vc->build();
	vc->output(out_str);
	vc->stat();
	cout << "file saved in " << out_str << endl;
	return 0;
}